

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

int definemacro(int f,int n)

{
  line *plVar1;
  line *lp2;
  line *lp1;
  int n_local;
  int f_local;
  
  macrocount = 0;
  if (macrodef == 0) {
    if (maclhead != (line *)0x0) {
      lp2 = maclhead->l_fp;
      while (lp2 != maclhead) {
        plVar1 = lp2->l_fp;
        free(lp2);
        lp2 = plVar1;
      }
      free(lp2);
    }
    plVar1 = lalloc(0);
    maclhead = plVar1;
    if (plVar1 == (line *)0x0) {
      n_local = 0;
    }
    else {
      ewprintf("Defining Keyboard Macro...");
      plVar1->l_bp = plVar1;
      plVar1->l_fp = plVar1;
      macrodef = 1;
      n_local = 1;
      maclcur = plVar1;
    }
  }
  else {
    ewprintf("already defining macro");
    macrodef = 0;
    n_local = 0;
  }
  return n_local;
}

Assistant:

int
definemacro(int f, int n)
{
	struct line	*lp1, *lp2;

	macrocount = 0;

	if (macrodef) {
		ewprintf("already defining macro");
		return (macrodef = FALSE);
	}

	/* free lines allocated for string arguments */
	if (maclhead != NULL) {
		for (lp1 = maclhead->l_fp; lp1 != maclhead; lp1 = lp2) {
			lp2 = lp1->l_fp;
			free(lp1);
		}
		free(lp1);
	}

	if ((maclhead = lp1 = lalloc(0)) == NULL)
		return (FALSE);

	ewprintf("Defining Keyboard Macro...");
	maclcur = lp1->l_fp = lp1->l_bp = lp1;
	return (macrodef = TRUE);
}